

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_deleted_doc_right_before_the_end_test(void)

{
  char cmd [256];
  char valuebuf [256];
  char keybuf [256];
  fdb_status s;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_doc *rdoc;
  fdb_iterator *fit;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined2 in_stack_fffffffffffffa48;
  undefined2 uVar1;
  undefined2 in_stack_fffffffffffffa4a;
  undefined2 uVar2;
  undefined4 in_stack_fffffffffffffa4c;
  fdb_iterator *in_stack_fffffffffffffa58;
  size_t in_stack_fffffffffffffa68;
  void *in_stack_fffffffffffffa70;
  fdb_kvs_handle *in_stack_fffffffffffffa78;
  void *in_stack_fffffffffffffa80;
  fdb_kvs_handle *in_stack_fffffffffffffa88;
  fdb_doc **in_stack_fffffffffffffac0;
  fdb_iterator *in_stack_fffffffffffffac8;
  char local_498 [136];
  fdb_kvs_config *in_stack_fffffffffffffbf0;
  char *in_stack_fffffffffffffbf8;
  fdb_kvs_handle **in_stack_fffffffffffffc00;
  fdb_file_handle *in_stack_fffffffffffffc08;
  fdb_config *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc70;
  fdb_file_handle **in_stack_fffffffffffffc78;
  long local_298 [33];
  fdb_status local_18c;
  undefined1 local_170 [8];
  undefined8 local_168;
  long local_78;
  fdb_iterator *local_70;
  fdb_kvs_handle *local_68;
  int local_58;
  uint local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  memleak_start();
  fdb_get_default_config();
  memcpy(local_170,&stack0xfffffffffffffa70,0xf8);
  local_168 = 0;
  fdb_get_default_kvs_config();
  sprintf(local_498,"rm -rf  %s*","./dummy");
  local_58 = system(local_498);
  fdb_open(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  fdb_kvs_open(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
               in_stack_fffffffffffffbf0);
  for (local_54 = 0; (int)local_54 < 3; local_54 = local_54 + 1) {
    sprintf((char *)local_298,"k%06d\n",(ulong)local_54);
    sprintf(&stack0xfffffffffffffc68,"v%06d\n",(ulong)local_54);
    fdb_set_kv(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,(size_t)in_stack_fffffffffffffa78
               ,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  }
  local_54 = 1;
  sprintf((char *)local_298,"k%06d\n",1);
  fdb_del_kv(in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
  fdb_commit((fdb_file_handle *)
             CONCAT44(in_stack_fffffffffffffa4c,
                      CONCAT22(in_stack_fffffffffffffa4a,in_stack_fffffffffffffa48)),'\0');
  sprintf((char *)local_298,"a");
  sprintf(local_498,"z");
  uVar1 = 2;
  uVar2 = 0;
  local_18c = fdb_iterator_init(local_68,&local_70,local_298,1,local_498,1,2);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf6d);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf6d,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_18c = fdb_iterator_seek_to_max
                        ((fdb_iterator *)CONCAT44(in_stack_fffffffffffffa4c,CONCAT22(uVar2,uVar1)));
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf70);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf70,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_78 = 0;
  local_18c = fdb_iterator_get(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf74);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf74,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_54 = 2;
  sprintf((char *)local_298,"k%06d\n",2);
  if (**(long **)(local_78 + 0x20) != local_298[0]) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_298,
            *(undefined8 *)(local_78 + 0x20),
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf77);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf77,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  fdb_doc_free((fdb_doc *)0x11faf4);
  local_18c = fdb_iterator_prev((fdb_iterator *)
                                CONCAT44(in_stack_fffffffffffffa4c,CONCAT22(uVar2,uVar1)));
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf7b);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf7b,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_78 = 0;
  local_18c = fdb_iterator_get(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf7f);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf7f,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_54 = 0;
  sprintf((char *)local_298,"k%06d\n",0);
  if (**(long **)(local_78 + 0x20) != local_298[0]) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_298,
            *(undefined8 *)(local_78 + 0x20),
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf82);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf82,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  fdb_doc_free((fdb_doc *)0x11fcb9);
  fdb_iterator_close(in_stack_fffffffffffffa58);
  uVar1 = 2;
  uVar2 = 0;
  local_18c = fdb_iterator_init(local_68,&local_70,local_298,1,local_498,1,2);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf89);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf89,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_18c = fdb_iterator_seek_to_min
                        ((fdb_iterator *)CONCAT44(in_stack_fffffffffffffa4c,CONCAT22(uVar2,uVar1)));
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf8c);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf8c,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_78 = 0;
  local_18c = fdb_iterator_get(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf90);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf90,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_54 = 0;
  sprintf((char *)local_298,"k%06d\n",0);
  if (**(long **)(local_78 + 0x20) != local_298[0]) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_298,
            *(undefined8 *)(local_78 + 0x20),
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf93);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0xf93,"void iterator_deleted_doc_right_before_the_end_test()");
  }
  fdb_doc_free((fdb_doc *)0x11ff2c);
  local_18c = fdb_iterator_next((fdb_iterator *)
                                CONCAT44(in_stack_fffffffffffffa4c,CONCAT22(uVar2,uVar1)));
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf97);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf97,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_78 = 0;
  local_18c = fdb_iterator_get(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  if (local_18c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0xf9b);
    iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
    if (local_18c != FDB_RESULT_SUCCESS) {
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0xf9b,"void iterator_deleted_doc_right_before_the_end_test()");
    }
  }
  local_54 = 2;
  sprintf((char *)local_298,"k%06d\n",2);
  if (**(long **)(local_78 + 0x20) == local_298[0]) {
    fdb_doc_free((fdb_doc *)0x1200f1);
    fdb_iterator_close(in_stack_fffffffffffffa58);
    fdb_close((fdb_file_handle *)CONCAT44(in_stack_fffffffffffffa4c,CONCAT22(uVar2,uVar1)));
    fdb_shutdown();
    memleak_end();
    if (iterator_deleted_doc_right_before_the_end_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","iterator deleted doc right before the end of iteration test");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","iterator deleted doc right before the end of iteration test");
    }
    return;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",local_298,
          *(undefined8 *)(local_78 + 0x20),
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0xf9e);
  iterator_deleted_doc_right_before_the_end_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0xf9e,"void iterator_deleted_doc_right_before_the_end_test()");
}

Assistant:

void iterator_deleted_doc_right_before_the_end_test()
{
    TEST_INIT();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *fit;
    fdb_doc *rdoc;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[256], cmd[256];

    memleak_start();

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    sprintf(cmd, SHELL_DEL " %s*", "./dummy");
    r = system(cmd); (void)r;

    fdb_open(&dbfile, "./dummy", &config);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // insert 3 docs
    for (i=0;i<3;++i) {
        sprintf(keybuf, "k%06d\n", i);
        sprintf(valuebuf, "v%06d\n", i);
        fdb_set_kv(db, keybuf, 8, valuebuf, 8);
    }

    // delete the middle doc
    i = 1;
    sprintf(keybuf, "k%06d\n", i);
    fdb_del_kv(db, keybuf, 8);

    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    sprintf(keybuf, "a");
    sprintf(cmd, "z");
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_max(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_prev(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    // opposite case
    s = fdb_iterator_init(db, &fit, keybuf, 1, cmd, 1, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_iterator_seek_to_min(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 0;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    s = fdb_iterator_next(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    rdoc = NULL;
    s = fdb_iterator_get(fit, &rdoc);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    i = 2;
    sprintf(keybuf, "k%06d\n", i);
    TEST_CMP(rdoc->key, keybuf, 8);
    fdb_doc_free(rdoc);

    fdb_iterator_close(fit);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator deleted doc right before the end of iteration test");
}